

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O3

void __thiscall chrono::ChMatterSPH::AddNode(ChMatterSPH *this,ChVector<double> *initial_state)

{
  ChCollisionModel *pCVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  shared_ptr<chrono::ChNodeSPH> newp;
  value_type local_58;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  undefined1 local_38 [16];
  undefined8 local_28;
  
  local_58.super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChNodeSPH,std::allocator<chrono::ChNodeSPH>>
            (&local_58.super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(ChNodeSPH **)&local_58,(allocator<chrono::ChNodeSPH> *)local_38);
  (local_58.super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->container =
       this;
  if (&((local_58.super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       super_ChNodeXYZ).pos != initial_state) {
    ((local_58.super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChNodeXYZ).pos.m_data[0] = initial_state->m_data[0];
    ((local_58.super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChNodeXYZ).pos.m_data[1] = initial_state->m_data[1];
    ((local_58.super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChNodeXYZ).pos.m_data[2] = initial_state->m_data[2];
  }
  std::
  vector<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>::
  push_back(&this->nodes,&local_58);
  ((local_58.super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->variables).
  user_data = this;
  local_48 = (this->matsurface).
             super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Stack_40 = (this->matsurface).
               super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
  pCVar1 = (local_58.super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           collision_model;
  p_Var2 = (this->matsurface).
           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_38 = ZEXT816(0) << 0x20;
  local_28 = 0;
  (*pCVar1->_vptr_ChCollisionModel[0x13])(0x3fb999999999999a,pCVar1,&local_48);
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
  }
  (*(local_58.super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    collision_model->_vptr_ChCollisionModel[4])();
  if (local_58.super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChMatterSPH::AddNode(ChVector<double> initial_state) {
    auto newp = chrono_types::make_shared<ChNodeSPH>();

    newp->SetContainer(this);

    newp->SetPos(initial_state);

    nodes.push_back(newp);

    newp->variables.SetUserData((void*)this);  // UserData unuseful in future cuda solver?

    newp->collision_model->AddPoint(matsurface, 0.1);  //***TEST***
    newp->collision_model->BuildModel();   // will also add to system, if collision is on.
}